

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QGenericArrayOps<QItemSelectionRange>::copyAppend
          (QGenericArrayOps<QItemSelectionRange> *this,QItemSelectionRange *b,QItemSelectionRange *e
          )

{
  qsizetype *pqVar1;
  QItemSelectionRange *pQVar2;
  long lVar3;
  
  if ((b != e) && (b < e)) {
    pQVar2 = (this->super_QArrayDataPointer<QItemSelectionRange>).ptr;
    do {
      lVar3 = (this->super_QArrayDataPointer<QItemSelectionRange>).size;
      QPersistentModelIndex::QPersistentModelIndex(&pQVar2[lVar3].tl,&b->tl);
      QPersistentModelIndex::QPersistentModelIndex(&pQVar2[lVar3].br,&b->br);
      pqVar1 = &(this->super_QArrayDataPointer<QItemSelectionRange>).size;
      *pqVar1 = *pqVar1 + 1;
      b = b + 1;
    } while (b < e);
  }
  return;
}

Assistant:

void copyAppend(const T *b, const T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e) // short-cut and handling the case b and e == nullptr
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(*b);
            ++b;
            ++this->size;
        }
    }